

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O3

int image_oprom_get_device(igsc_oprom_image *img,uint32_t num,oprom_subsystem_device_id *device)

{
  long lVar1;
  mft_oprom_device_type_ext *pmVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  igsc_log_func_t p_Var7;
  char *pcVar8;
  oprom_subsystem_device_id *poVar9;
  oprom_subsystem_device_id oVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  char __time_buf [128];
  
  uVar11 = (ulong)num;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = image_oprom_count_devices(img);
  uVar5 = igsc_get_log_level();
  if (uVar5 != 0) {
    p_Var7 = igsc_get_log_callback_func();
    if (p_Var7 == (igsc_log_func_t)0x0) {
      pcVar8 = gsc_time(__time_buf,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar8,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
             "image_oprom_get_device",0x319,(ulong)uVar4,uVar11);
    }
    else {
      p_Var7 = igsc_get_log_callback_func();
      pcVar8 = gsc_time(__time_buf,0x80);
      (*p_Var7)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
                "image_oprom_get_device",0x319,(ulong)uVar4,uVar11);
    }
  }
  iVar6 = 4;
  if (uVar4 <= num) goto LAB_0011a8ea;
  if (device == (oprom_subsystem_device_id *)0x0) {
LAB_0011a8e8:
    iVar6 = 0;
  }
  else {
    pmVar2 = (img->cpd_img).dev_ext;
    poVar9 = (oprom_subsystem_device_id *)(&pmVar2[1].extension_type + uVar11);
    iVar6 = 0;
    oVar10.subsys_vendor_id = 0;
    oVar10.subsys_device_id = 0;
    if (poVar9 != (oprom_subsystem_device_id *)0x0) {
      bVar3 = device + 1 <= poVar9;
      if (poVar9 < device) {
        bVar3 = (oprom_subsystem_device_id *)((long)&pmVar2[1].extension_type + uVar11 * 4 + 3) <
                device;
      }
      if (!bVar3) goto LAB_0011a8e8;
      oVar10 = *poVar9;
    }
    *device = oVar10;
  }
LAB_0011a8ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int image_oprom_get_device(struct igsc_oprom_image *img, uint32_t num,
                           struct oprom_subsystem_device_id *device)
{
    uint32_t max_num = image_oprom_count_devices(img);

    gsc_debug("max_num %u num %u\n", max_num, num);
    if (num < max_num)
    {
        gsc_memcpy_s(device, sizeof(*device),
                     &img->cpd_img.dev_ext->device_ids[num],
                     sizeof(*device));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_DEVICE_NOT_FOUND;
}